

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void tge_setup2(tgestate_t *state)

{
  byte bVar1;
  int iVar2;
  void *__dest;
  tgestate_t *state_00;
  byte *pbVar3;
  long in_RDI;
  vischar_t *vischar;
  int carry;
  uint8_t iters;
  uint8_t byte;
  uint8_t counter;
  uint8_t *reversed;
  vischar_t vischar_initial;
  char local_53;
  byte local_52;
  byte local_51;
  byte *local_50;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = in_RDI;
  memcpy(local_48,&DAT_00123558,0x40);
  local_50 = (byte *)(local_8 + 0x2c0);
  do {
    local_51 = (char)local_50 - ((char)local_8 + -0x40);
    local_52 = 0;
    local_53 = '\b';
    do {
      bVar1 = local_51 & 1;
      local_51 = (byte)((int)(uint)local_51 >> 1);
      local_52 = local_52 << 1 | bVar1;
      local_53 = local_53 + -1;
    } while (local_53 != '\0');
    pbVar3 = local_50 + 1;
    *local_50 = local_52;
    local_50 = pbVar3;
  } while (pbVar3 != (byte *)(local_8 + 0x3c0));
  __dest = (void *)(local_8 + 0x3c0);
  local_53 = '\b';
  do {
    memcpy(__dest,local_48,0x40);
    __dest = (void *)((long)__dest + 0x40);
    local_53 = local_53 + -1;
  } while (local_53 != '\0');
  local_53 = '\a';
  state_00 = (tgestate_t *)(local_8 + 0x400);
  do {
    *(undefined1 *)&state_00->width = 0xff;
    *(undefined1 *)((long)&state_00->width + 1) = 0xff;
    state_00 = (tgestate_t *)(state_00->jmpbuf_main[0].__jmpbuf + 4);
    local_53 = local_53 + -1;
  } while (local_53 != '\0');
  iVar2 = _setjmp((__jmp_buf_tag *)(local_8 + 0x20));
  if (iVar2 == 0) {
    reset_game(state_00);
  }
  return;
}

Assistant:

TGE_API void tge_setup2(tgestate_t *state)
{
  /**
   * $F1C9: Initial state of a visible character.
   *
   * The original game stores just 23 bytes of the structure, we store a
   * whole structure here.
   *
   * This can't be a _static_ const structure as it contains references which
   * are not compile time constant.
   */
  const vischar_t vischar_initial =
  {
    0,                    // character
    0,                    // flags
    { 44, 1 },            // route
    { 46, 46, 24 },       // pos
    0,                    // counter_and_flags
    &animations[0],       // animbase
    (const anim_t *) anim_wait_tl,   //animations[8],        // anim
    0,                    // animindex
    0,                    // input
    direction_TOP_LEFT,   // direction
    { { 0, 0, 24 }, &sprites[sprite_PRISONER_FACING_AWAY_1], 0 }, // mi
    { 0, 0 },             // scrx, scry
    room_0_OUTDOORS,      // room
    0,                    // unused
    0,                    // width_bytes
    0,                    // height
  };

  uint8_t   *reversed; /* was HL */
  uint8_t    counter;  /* was A */
  uint8_t    byte;     /* was C */
  uint8_t    iters;    /* was B */
  int        carry = 0;
  vischar_t *vischar;  /* was HL */

  assert(state != NULL);

  /* Construct a table of 256 bit-reversed bytes in state->reversed[]. */
  reversed = &state->reversed[0];
  do
  {
    /* This was 'A = L;' in original code as alignment was guaranteed. */
    counter = reversed - &state->reversed[0]; /* Get a counter 0..255. */ // note: narrowing

    /* Reverse the counter byte. */
    byte = 0;
    iters = 8;
    do
    {
      carry = counter & 1;
      counter >>= 1;
      byte = (byte << 1) | carry;
    }
    while (--iters);

    *reversed++ = byte;
  }
  while (reversed != &state->reversed[256]); // was ((HL & 0xFF) != 0);

  /* Initialise all visible characters. */
  // FUTURE: Fold this to:
  // for (vischar = &state->vischars[0]; vischar < &state->vischars[vischars_LENGTH]; vischar++)
  //   *vischar = vischar_initial;
  vischar = &state->vischars[0];
  iters = vischars_LENGTH;
  do
  {
    memcpy(vischar, &vischar_initial, sizeof(vischar_initial));
    vischar++;
  }
  while (--iters);

  /* Write (character_NONE, vischar_FLAGS_EMPTY_SLOT) over all non-visible
   * characters. */
  iters = vischars_LENGTH - 1;
  vischar = &state->vischars[1];
  do
  {
    vischar->character = character_NONE;
    vischar->flags     = vischar_FLAGS_EMPTY_SLOT;
    vischar++;
  }
  while (--iters);

  // Conv: Set up a jmpbuf so the game will return here.
  if (setjmp(state->jmpbuf_main) == 0)
  {
    /* In the original code this wiped all state from $8100 up until the
     * start of tiles ($8218). We'll assume for now that tgestate_t is
     * calloc'd and so zeroed by default. */

    reset_game(state);

    // reset_game, which in turn calls enter_room which exits via longjmp to after this if statement block

    // i reckon this never gets this far, as reset_game jumps to enter_room itself
    //enter_room(state); // returns by goto main_loop
    NEVER_RETURNS;
  }
  // we arrive here once the game is initialised and the initial bedroom scene is drawn and zoomboxed onto the screen
}